

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args,PyObject *kwargs)

{
  PyTypeObject *pPVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  PyObject *pPVar7;
  type_info *ptVar8;
  long lVar9;
  char *pcVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int local_118;
  allocator local_101;
  tuple args_;
  ulong local_e0;
  string sig;
  handle local_b0;
  undefined1 local_a8 [32];
  tuple args__1;
  PyTypeObject *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar3 = (undefined8 *)PyCapsule_GetPointer(self,0);
  if ((args->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                  ,0x184,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar14 = args[1].ob_refcnt;
  if (kwargs == (PyObject *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = PyDict_Size(kwargs);
  }
  puVar12 = puVar3;
  if (uVar14 == 0) {
    local_68 = (PyTypeObject *)0x0;
  }
  else {
    if ((args->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(args)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                    ,0x187,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_68 = args[1].ob_type;
  }
  for (; puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)puVar12[0xf]) {
    args->ob_refcnt = args->ob_refcnt + 1;
    local_e0 = (long)(puVar12[4] - puVar12[3]) / 0x18;
    args_.super_object.super_handle.m_ptr = (object)(object)args;
    if (uVar14 < local_e0) {
      tuple::tuple((tuple *)&sig,local_e0);
      object::operator=(&args_.super_object,(object *)&sig);
      object::~object((object *)&sig);
      for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
        if ((args->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x19a,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        pPVar1 = (&args[1].ob_type)[uVar5];
        if (pPVar1 != (PyTypeObject *)0x0) {
          (pPVar1->ob_base).ob_base.ob_refcnt = (pPVar1->ob_base).ob_base.ob_refcnt + 1;
        }
        if ((*(byte *)(*(long *)((long)args_.super_object.super_handle.m_ptr + 8) + 0xab) & 4) == 0)
        {
          __assert_fail("PyTuple_Check(args_.ptr())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x19b,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        *(PyTypeObject **)((long)args_.super_object.super_handle.m_ptr + 0x18 + uVar5 * 8) = pPVar1;
      }
      puVar2 = (undefined8 *)puVar12[4];
      lVar13 = 0x18;
      lVar9 = 0;
      for (puVar11 = (undefined8 *)puVar12[3]; puVar11 != puVar2; puVar11 = puVar11 + 3) {
        if ((*(byte *)(*(long *)((long)args_.super_object.super_handle.m_ptr + 8) + 0xab) & 4) == 0)
        {
          __assert_fail("PyTuple_Check(args_.ptr())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                        ,0x1a1,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        if (*(long *)((long)args_.super_object.super_handle.m_ptr + lVar13) == 0) {
          if ((kwargs == (PyObject *)0x0) ||
             (plVar6 = (long *)PyDict_GetItemString(kwargs,*puVar11), plVar6 == (long *)0x0)) {
            plVar6 = (long *)puVar11[2];
            if (plVar6 == (long *)0x0) {
              lVar9 = -1;
              break;
            }
          }
          else {
            lVar9 = lVar9 + 1;
          }
          *plVar6 = *plVar6 + 1;
          if ((*(byte *)(*(long *)((long)args_.super_object.super_handle.m_ptr + 8) + 0xab) & 4) ==
              0) {
            __assert_fail("PyTuple_Check(args_.ptr())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                          ,0x1ae,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          *(long **)((long)args_.super_object.super_handle.m_ptr + lVar13) = plVar6;
        }
        lVar13 = lVar13 + 8;
      }
    }
    else {
      lVar9 = 0;
      local_e0 = uVar14;
    }
    if (((lVar9 == lVar4) ||
        (pPVar7 = (PyObject *)0x1, (*(byte *)((long)puVar12 + 0x59) & 0x10) != 0)) &&
       ((local_e0 == *(ushort *)((long)puVar12 + 0x5a) ||
        (pPVar7 = (PyObject *)0x1, (*(byte *)((long)puVar12 + 0x59) & 8) != 0)))) {
      pPVar7 = (PyObject *)
               (*(code *)puVar12[6])(puVar12,args_.super_object.super_handle.m_ptr,kwargs,local_68);
    }
    object::~object(&args_.super_object);
    if (pPVar7 != (PyObject *)0x1) {
      if (pPVar7 != (PyObject *)0x0) {
        if ((*(byte *)((long)puVar3 + 0x59) & 1) == 0) {
          return pPVar7;
        }
        if ((args->ob_type->tp_flags & 0x4000000) != 0) {
          pPVar1 = args[1].ob_type;
          ptVar8 = detail::get_type_info((pPVar1->ob_base).ob_base.ob_type);
          (*ptVar8->init_holder)((PyObject *)pPVar1,(void *)0x0);
          return pPVar7;
        }
        __assert_fail("PyTuple_Check(args)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                      ,0x215,
                      "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                     );
      }
      std::__cxx11::string::string
                ((string *)&args_,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 (allocator *)&sig);
      std::__cxx11::string::append((char *)&args_);
      PyErr_SetString(_PyExc_TypeError,args_.super_object.super_handle.m_ptr);
      goto LAB_0010c5e1;
    }
  }
  if ((*(byte *)((long)puVar3 + 0x59) & 4) == 0) {
    std::__cxx11::string::string((string *)&args__1,(char *)*puVar3,(allocator *)&local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args__1,
                   "(): incompatible ");
    pcVar10 = "function";
    if ((*(byte *)((long)puVar3 + 0x59) & 1) != 0) {
      pcVar10 = "constructor";
    }
    std::__cxx11::string::string((string *)&local_50,pcVar10,&local_101);
    std::operator+(&sig,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a8,&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_,&sig,
                   " arguments. The following argument types are supported:\n");
    std::__cxx11::string::~string((string *)&sig);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&args__1);
    local_118 = 1;
    for (puVar12 = puVar3; puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)puVar12[0xf]) {
      std::__cxx11::to_string((string *)&args__1,local_118);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     "    ",(string *)&args__1);
      std::operator+(&sig,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8,". ");
      std::__cxx11::string::append((string *)&args_);
      std::__cxx11::string::~string((string *)&sig);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)&args__1);
      if ((*(byte *)((long)puVar3 + 0x59) & 1) == 0) {
LAB_0010c454:
        std::__cxx11::string::append((char *)&args_);
      }
      else {
        std::__cxx11::string::string((string *)&sig,(char *)puVar12[2],(allocator *)local_a8);
        lVar4 = std::__cxx11::string::find((char)&sig,0x28);
        uVar14 = lVar4 + 7;
        if (sig._M_string_length <= uVar14) {
LAB_0010c447:
          std::__cxx11::string::~string((string *)&sig);
          goto LAB_0010c454;
        }
        uVar5 = std::__cxx11::string::find((char *)&sig,0x10fc9f);
        std::__cxx11::string::rfind((char *)&sig,0x10fca2);
        if (uVar5 < sig._M_string_length) {
          uVar15 = uVar5 + 2;
        }
        else {
          uVar5 = std::__cxx11::string::find((char)&sig,0x29);
          uVar15 = uVar5;
        }
        if ((uVar5 <= uVar14) || (sig._M_string_length <= uVar15)) goto LAB_0010c447;
        std::__cxx11::string::append((string *)&args_,(ulong)&sig,uVar14);
        std::__cxx11::string::push_back('\0');
        std::__cxx11::string::append((string *)&args_,(ulong)&sig,uVar15);
        std::__cxx11::string::~string((string *)&sig);
      }
      std::__cxx11::string::append((char *)&args_);
      local_118 = local_118 + 1;
    }
    std::__cxx11::string::append((char *)&args_);
    args->ob_refcnt = args->ob_refcnt + 1;
    uVar14 = (ulong)(*(byte *)((long)puVar3 + 0x59) & 1);
    args__1.super_object.super_handle.m_ptr = (object)(object)args;
    while (uVar5 = PyTuple_Size(args__1.super_object.super_handle.m_ptr), uVar14 < uVar5) {
      local_a8._8_8_ = args__1.super_object.super_handle.m_ptr;
      local_a8._24_8_ = 0;
      local_a8._16_8_ = uVar14;
      detail::accessor::operator_cast_to_object((accessor *)&local_b0);
      repr((pybind11 *)&local_50,local_b0);
      str::operator_cast_to_string(&sig,(str *)&local_50);
      std::__cxx11::string::append((string *)&args_);
      std::__cxx11::string::~string((string *)&sig);
      object::~object((object *)&local_50);
      object::~object((object *)&local_b0);
      object::~object((object *)(local_a8 + 0x18));
      uVar5 = PyTuple_Size(args__1.super_object.super_handle.m_ptr);
      uVar14 = uVar14 + 1;
      if (uVar14 != uVar5) {
        std::__cxx11::string::append((char *)&args_);
      }
    }
    PyErr_SetString(_PyExc_TypeError,args_.super_object.super_handle.m_ptr);
    object::~object(&args__1.super_object);
LAB_0010c5e1:
    std::__cxx11::string::~string((string *)&args_);
    pPVar7 = (PyObject *)0x0;
  }
  else {
    pPVar7 = (PyObject *)&_Py_NotImplementedStruct;
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
  }
  return pPVar7;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args, PyObject *kwargs) {
        /* Iterator over the list of potentially admissible overloads */
        detail::function_record *overloads = (detail::function_record *) PyCapsule_GetPointer(self, nullptr),
                                *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        size_t nargs = (size_t) PyTuple_GET_SIZE(args),
               nkwargs = kwargs ? (size_t) PyDict_Size(kwargs) : 0;

        handle parent = nargs > 0 ? PyTuple_GET_ITEM(args, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;
        try {
            for (; it != nullptr; it = it->next) {
                auto args_ = reinterpret_borrow<tuple>(args);
                size_t kwargs_consumed = 0;

                /* For each overload:
                   1. If the required list of arguments is longer than the
                      actually provided amount, create a copy of the argument
                      list and fill in any available keyword/default arguments.
                   2. Ensure that all keyword arguments were "consumed"
                   3. Call the function call dispatcher (function_record::impl)
                 */
                size_t nargs_ = nargs;
                if (nargs < it->args.size()) {
                    nargs_ = it->args.size();
                    args_ = tuple(nargs_);
                    for (size_t i = 0; i < nargs; ++i) {
                        handle item = PyTuple_GET_ITEM(args, i);
                        PyTuple_SET_ITEM(args_.ptr(), i, item.inc_ref().ptr());
                    }

                    int arg_ctr = 0;
                    for (auto const &it2 : it->args) {
                        int index = arg_ctr++;
                        if (PyTuple_GET_ITEM(args_.ptr(), index))
                            continue;

                        handle value;
                        if (kwargs)
                            value = PyDict_GetItemString(kwargs, it2.name);

                        if (value)
                            kwargs_consumed++;
                        else if (it2.value)
                            value = it2.value;

                        if (value) {
                            PyTuple_SET_ITEM(args_.ptr(), index, value.inc_ref().ptr());
                        } else {
                            kwargs_consumed = (size_t) -1; /* definite failure */
                            break;
                        }
                    }
                }

                try {
                    if ((kwargs_consumed == nkwargs || it->has_kwargs) &&
                        (nargs_ == it->nargs || it->has_args))
                        result = it->impl(it, args_, kwargs, parent);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = pybind11::detail::get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (detail::function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                PyObject *inst = PyTuple_GET_ITEM(args, 0);
                auto tinfo = detail::get_type_info(Py_TYPE(inst));
                tinfo->init_holder(inst, nullptr);
            }
            return result.ptr();
        }
    }